

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int binchrr(bstring b0,int pos,bstring b1)

{
  int iVar1;
  undefined1 local_68 [8];
  charField chrs;
  bstring b1_local;
  int pos_local;
  bstring b0_local;
  
  if ((((pos < 0) || (b0 == (bstring)0x0)) || (b0->data == (uchar *)0x0)) || (b0->slen < pos)) {
    b0_local._4_4_ = -1;
  }
  else {
    b1_local._4_4_ = pos;
    if (pos == b0->slen) {
      b1_local._4_4_ = pos + -1;
    }
    chrs.content[7] = (unsigned_long)b1;
    iVar1 = buildCharField((charField *)local_68,b1);
    if (iVar1 < 0) {
      b0_local._4_4_ = -1;
    }
    else {
      b0_local._4_4_ = binchrrCF(b0->data,b1_local._4_4_,(charField *)local_68);
    }
  }
  return b0_local._4_4_;
}

Assistant:

int binchrr (const bstring b0, int pos, const bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL ||
	    b0->slen < pos) return BSTR_ERR;
	if (pos == b0->slen) pos--;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	return binchrrCF (b0->data, pos, &chrs);
}